

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O0

void __thiscall
slang::ast::DistVarVisitor::visit<slang::ast::CallExpression>
          (DistVarVisitor *this,CallExpression *expr)

{
  ExpressionKind EVar1;
  SourceRange sourceRange;
  RandMode RVar2;
  SourceLocation SVar3;
  CallExpression *in_RSI;
  long in_RDI;
  bool unaff_retaddr;
  Expression *in_stack_00000008;
  Symbol *in_stack_00000010;
  ASTContext *in_stack_00000018;
  RandMode mode;
  Symbol *sym;
  DistVarVisitor *in_stack_ffffffffffffffe8;
  
  EVar1 = (in_RSI->super_Expression).kind;
  if ((EVar1 - NamedValue < 2) || (EVar1 - ElementSelect < 3)) {
    SVar3 = (SourceLocation)Expression::getSymbolReference(in_stack_00000008,unaff_retaddr);
    if (SVar3 != (SourceLocation)0x0) {
      RVar2 = ASTContext::getRandMode(in_stack_00000018,in_stack_00000010);
      if (RVar2 == Rand) {
        *(undefined1 *)(in_RDI + 8) = 1;
      }
      else if (RVar2 == RandC) {
        sourceRange.endLoc = SVar3;
        sourceRange.startLoc = (SourceLocation)0x200380008;
        ASTContext::addDiag((ASTContext *)(in_RSI->super_Expression).sourceRange.endLoc,
                            SUB84((ulong)in_RSI >> 0x20,0),sourceRange);
      }
    }
  }
  else {
    CallExpression::visitExprs<slang::ast::DistVarVisitor&>(in_RSI,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue:
                case ExpressionKind::MemberAccess:
                case ExpressionKind::ElementSelect:
                case ExpressionKind::RangeSelect: {
                    if (auto sym = expr.getSymbolReference()) {
                        RandMode mode = context.getRandMode(*sym);
                        if (mode == RandMode::Rand)
                            anyRandVars = true;
                        else if (mode == RandMode::RandC)
                            context.addDiag(diag::RandCInDist, expr.sourceRange);
                    }
                    break;
                }
                default:
                    if constexpr (HasVisitExprs<T, DistVarVisitor>)
                        expr.visitExprs(*this);
                    break;
            }
        }
    }